

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

bool __thiscall
double_conversion::DoubleToStringConverter::HandleSpecialValues
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  
  if (ABS(value) == INFINITY) {
    __s = this->infinity_symbol_;
    if (__s == (char *)0x0) {
      return false;
    }
    if (value < 0.0) {
      iVar1 = result_builder->position_;
      result_builder->position_ = iVar1 + 1;
      (result_builder->buffer_).start_[iVar1] = '-';
      __s = this->infinity_symbol_;
    }
  }
  else {
    if (((ulong)value & 0xfffffffffffff) == 0 || (~(ulong)value & 0x7ff0000000000000) != 0) {
      return false;
    }
    __s = this->nan_symbol_;
    if (__s == (char *)0x0) {
      return false;
    }
  }
  sVar2 = strlen(__s);
  memmove((result_builder->buffer_).start_ + result_builder->position_,__s,(long)(int)sVar2);
  result_builder->position_ = result_builder->position_ + (int)sVar2;
  return true;
}

Assistant:

bool DoubleToStringConverter::HandleSpecialValues(
    double value,
    StringBuilder* result_builder) const {
  Double double_inspect(value);
  if (double_inspect.IsInfinite()) {
    if (infinity_symbol_ == NULL) return false;
    if (value < 0) {
      result_builder->AddCharacter('-');
    }
    result_builder->AddString(infinity_symbol_);
    return true;
  }
  if (double_inspect.IsNan()) {
    if (nan_symbol_ == NULL) return false;
    result_builder->AddString(nan_symbol_);
    return true;
  }
  return false;
}